

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

_Bool upb_MiniTable_NextOneofField(upb_MiniTable *m,upb_MiniTableField **f)

{
  upb_MiniTableField *puVar1;
  upb_MiniTableField *puVar2;
  upb_MiniTableField *puVar3;
  upb_MiniTableField *puVar4;
  
  puVar3 = (upb_MiniTableField *)
           ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                   number_dont_copy_me__upb_internal_use_only +
           (ulong)((uint)m->field_count_dont_copy_me__upb_internal_use_only * 0xc));
  puVar1 = *f;
  do {
    puVar4 = puVar1 + 1;
    if (puVar3 <= puVar4) goto LAB_00298d9d;
    puVar2 = puVar1 + 1;
    puVar1 = puVar4;
  } while (puVar2->presence != (*f)->presence);
  *f = puVar4;
LAB_00298d9d:
  return puVar4 < puVar3;
}

Assistant:

bool upb_MiniTable_NextOneofField(const upb_MiniTable* m,
                                  const upb_MiniTableField** f) {
  const upb_MiniTableField* ptr = *f;
  const upb_MiniTableField* end =
      &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
  while (++ptr < end) {
    if (ptr->presence == (*f)->presence) {
      *f = ptr;
      return true;
    }
  }
  return false;
}